

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdGetTxInfoByHandle
              (void *handle,void *tx_data_handle,char **txid,char **wtxid,uint32_t *size,
              uint32_t *vsize,uint32_t *weight,uint32_t *version,uint32_t *locktime)

{
  AbstractTransaction *this;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  char *pcVar6;
  char *pcVar7;
  CfdException *this_00;
  TransactionContext *tx;
  bool is_bitcoin;
  string temp_txid;
  char *work_txid;
  string temp_wtxid;
  char *work_wtxid;
  bool local_101;
  Txid local_100;
  string local_e0;
  string local_c0;
  void *local_a0;
  char **local_98;
  char **local_90;
  char *local_88;
  ByteData256 local_80;
  uint32_t *local_68;
  uint32_t *local_60;
  string local_58;
  undefined8 local_38;
  
  local_88 = (char *)0x0;
  local_38 = 0;
  local_a0 = handle;
  local_98 = wtxid;
  local_90 = txid;
  local_68 = size;
  local_60 = vsize;
  cfd::Initialize();
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_101 = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_101);
  this = *(AbstractTransaction **)((long)tx_data_handle + 0x18);
  if (this != (AbstractTransaction *)0x0) {
    if (local_101 == true) {
      cfd::core::AbstractTransaction::GetTxid(&local_100,this);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_e0,&local_100);
      std::__cxx11::string::_M_assign((string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      local_100._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if (local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::AbstractTransaction::GetWitnessHash(&local_80,this);
      cfd::core::Txid::Txid(&local_100,&local_80);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_e0,&local_100);
      std::__cxx11::string::_M_assign((string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      local_100._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if (local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar1 = (*this->_vptr_AbstractTransaction[4])(this);
      uVar2 = (*this->_vptr_AbstractTransaction[5])(this);
      uVar3 = (*this->_vptr_AbstractTransaction[6])(this);
      uVar4 = cfd::core::AbstractTransaction::GetVersion(this);
      uVar5 = cfd::core::AbstractTransaction::GetLockTime(this);
    }
    else {
      cfd::core::AbstractTransaction::GetTxid(&local_100,this);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_e0,&local_100);
      std::__cxx11::string::_M_assign((string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      local_100._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if (local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::AbstractTransaction::GetWitnessHash(&local_80,this);
      cfd::core::Txid::Txid(&local_100,&local_80);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_e0,&local_100);
      std::__cxx11::string::_M_assign((string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      local_100._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if (local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar1 = (*this->_vptr_AbstractTransaction[4])(this);
      uVar2 = (*this->_vptr_AbstractTransaction[5])(this);
      uVar3 = (*this->_vptr_AbstractTransaction[6])(this);
      uVar4 = cfd::core::AbstractTransaction::GetVersion(this);
      uVar5 = cfd::core::AbstractTransaction::GetLockTime(this);
    }
    if (local_90 == (char **)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = cfd::capi::CreateString(&local_c0);
      local_88 = pcVar6;
    }
    if (local_98 == (char **)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = cfd::capi::CreateString(&local_58);
    }
    if (local_68 != (uint32_t *)0x0) {
      *local_68 = uVar1;
    }
    if (local_60 != (uint32_t *)0x0) {
      *local_60 = uVar2;
    }
    if (weight != (uint32_t *)0x0) {
      *weight = uVar3;
    }
    if (version != (uint32_t *)0x0) {
      *version = uVar4;
    }
    if (locktime != (uint32_t *)0x0) {
      *locktime = uVar5;
    }
    if (pcVar6 != (char *)0x0) {
      *local_90 = pcVar6;
    }
    if (pcVar7 != (char *)0x0) {
      *local_98 = pcVar7;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    return 0;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalStateError,&local_e0);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInfoByHandle(
    void* handle, void* tx_data_handle, char** txid, char** wtxid,
    uint32_t* size, uint32_t* vsize, uint32_t* weight, uint32_t* version,
    uint32_t* locktime) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_wtxid = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    uint32_t temp_size = 0;
    uint32_t temp_vsize = 0;
    uint32_t temp_weight = 0;
    uint32_t temp_version = 0;
    uint32_t temp_locktime = 0;
    std::string temp_txid;
    std::string temp_wtxid;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      temp_txid = tx->GetTxid().GetHex();
      temp_wtxid = Txid(tx->GetWitnessHash()).GetHex();
      temp_size = tx->GetTotalSize();
      temp_vsize = tx->GetVsize();
      temp_weight = tx->GetWeight();
      temp_version = tx->GetVersion();
      temp_locktime = tx->GetLockTime();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      temp_txid = tx->GetTxid().GetHex();
      temp_wtxid = Txid(tx->GetWitnessHash()).GetHex();
      temp_size = tx->GetTotalSize();
      temp_vsize = tx->GetVsize();
      temp_weight = tx->GetWeight();
      temp_version = tx->GetVersion();
      temp_locktime = tx->GetLockTime();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (txid != nullptr) work_txid = CreateString(temp_txid);
    if (wtxid != nullptr) work_wtxid = CreateString(temp_wtxid);
    if (size != nullptr) *size = temp_size;
    if (vsize != nullptr) *vsize = temp_vsize;
    if (weight != nullptr) *weight = temp_weight;
    if (version != nullptr) *version = temp_version;
    if (locktime != nullptr) *locktime = temp_locktime;

    if (work_txid != nullptr) *txid = work_txid;
    if (work_wtxid != nullptr) *wtxid = work_wtxid;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_wtxid);
  return result;
}